

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

int side1_7d_filter(double *p0,double *p1,double *q0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double local_108;
  double upper_bound_1;
  double lower_bound_1;
  double max2;
  double max1;
  double eps;
  int int_tmp_result;
  double q0_6_p0_6;
  double p1_6_p0_6;
  double q0_5_p0_5;
  double p1_5_p0_5;
  double q0_4_p0_4;
  double p1_4_p0_4;
  double q0_3_p0_3;
  double p1_3_p0_3;
  double q0_2_p0_2;
  double p1_2_p0_2;
  double q0_1_p0_1;
  double p1_1_p0_1;
  double q0_0_p0_0;
  double p1_0_p0_0;
  double r;
  double p0_6_p1_6;
  double p0_5_p1_5;
  double p0_4_p1_4;
  double p0_3_p1_3;
  double p0_2_p1_2;
  double p0_1_p1_1;
  double p0_0_p1_0;
  double *q0_local;
  double *p1_local;
  double *p0_local;
  
  dVar1 = *p0 - *p1;
  dVar2 = p0[1] - p1[1];
  dVar3 = p0[2] - p1[2];
  dVar4 = p0[3] - p1[3];
  dVar5 = p0[4] - p1[4];
  dVar6 = p0[5] - p1[5];
  dVar7 = p0[6] - p1[6];
  dVar8 = *p1 - *p0;
  dVar9 = *q0 - *p0;
  dVar10 = p1[1] - p0[1];
  dVar11 = q0[1] - p0[1];
  dVar12 = p1[2] - p0[2];
  dVar13 = q0[2] - p0[2];
  dVar14 = p1[3] - p0[3];
  dVar15 = q0[3] - p0[3];
  dVar16 = p1[4] - p0[4];
  dVar17 = q0[4] - p0[4];
  dVar18 = p1[5] - p0[5];
  dVar19 = q0[5] - p0[5];
  dVar20 = p1[6] - p0[6];
  dVar21 = q0[6] - p0[6];
  dVar22 = dVar20 * dVar21 +
           dVar18 * dVar19 +
           dVar16 * dVar17 + dVar14 * dVar15 + dVar12 * dVar13 + dVar8 * dVar9 + dVar10 * dVar11;
  dVar22 = (dVar7 * dVar7 +
           dVar6 * dVar6 +
           dVar5 * dVar5 + dVar4 * dVar4 + dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2) * 1.0 -
           (dVar22 + dVar22);
  max2 = ABS(dVar1);
  if (max2 < ABS(dVar2)) {
    max2 = ABS(dVar2);
  }
  if (max2 < ABS(dVar3)) {
    max2 = ABS(dVar3);
  }
  if (max2 < ABS(dVar4)) {
    max2 = ABS(dVar4);
  }
  if (max2 < ABS(dVar5)) {
    max2 = ABS(dVar5);
  }
  if (max2 < ABS(dVar6)) {
    max2 = ABS(dVar6);
  }
  if (max2 < ABS(dVar7)) {
    max2 = ABS(dVar7);
  }
  if (max2 < ABS(dVar8)) {
    max2 = ABS(dVar8);
  }
  if (max2 < ABS(dVar10)) {
    max2 = ABS(dVar10);
  }
  if (max2 < ABS(dVar12)) {
    max2 = ABS(dVar12);
  }
  if (max2 < ABS(dVar14)) {
    max2 = ABS(dVar14);
  }
  if (max2 < ABS(dVar16)) {
    max2 = ABS(dVar16);
  }
  if (max2 < ABS(dVar18)) {
    max2 = ABS(dVar18);
  }
  if (max2 < ABS(dVar20)) {
    max2 = ABS(dVar20);
  }
  lower_bound_1 = ABS(dVar1);
  if (lower_bound_1 < ABS(dVar2)) {
    lower_bound_1 = ABS(dVar2);
  }
  if (lower_bound_1 < ABS(dVar3)) {
    lower_bound_1 = ABS(dVar3);
  }
  if (lower_bound_1 < ABS(dVar4)) {
    lower_bound_1 = ABS(dVar4);
  }
  if (lower_bound_1 < ABS(dVar5)) {
    lower_bound_1 = ABS(dVar5);
  }
  if (lower_bound_1 < ABS(dVar6)) {
    lower_bound_1 = ABS(dVar6);
  }
  if (lower_bound_1 < ABS(dVar7)) {
    lower_bound_1 = ABS(dVar7);
  }
  if (lower_bound_1 < ABS(dVar9)) {
    lower_bound_1 = ABS(dVar9);
  }
  if (lower_bound_1 < ABS(dVar11)) {
    lower_bound_1 = ABS(dVar11);
  }
  if (lower_bound_1 < ABS(dVar13)) {
    lower_bound_1 = ABS(dVar13);
  }
  if (lower_bound_1 < ABS(dVar15)) {
    lower_bound_1 = ABS(dVar15);
  }
  if (lower_bound_1 < ABS(dVar17)) {
    lower_bound_1 = ABS(dVar17);
  }
  if (lower_bound_1 < ABS(dVar19)) {
    lower_bound_1 = ABS(dVar19);
  }
  if (lower_bound_1 < ABS(dVar21)) {
    lower_bound_1 = ABS(dVar21);
  }
  upper_bound_1 = max2;
  local_108 = max2;
  if (max2 <= lower_bound_1) {
    if (max2 < lower_bound_1) {
      local_108 = lower_bound_1;
    }
  }
  else {
    upper_bound_1 = lower_bound_1;
  }
  if (1.2708086158026695e-147 <= upper_bound_1) {
    if (local_108 <= 5.599361855444509e+101) {
      dVar1 = max2 * lower_bound_1 * 1.3777934958250494e-14;
      if (dVar22 <= dVar1) {
        if (-dVar1 <= dVar22) {
          return 0;
        }
        eps._4_4_ = -1;
      }
      else {
        eps._4_4_ = 1;
      }
      p0_local._4_4_ = eps._4_4_;
    }
    else {
      p0_local._4_4_ = 0;
    }
  }
  else {
    p0_local._4_4_ = 0;
  }
  return p0_local._4_4_;
}

Assistant:

inline int side1_7d_filter( const double* p0, const double* p1, const double* q0) {
    double p0_0_p1_0 = (p0[0] - p1[0]);
    double p0_1_p1_1 = (p0[1] - p1[1]);
    double p0_2_p1_2 = (p0[2] - p1[2]);
    double p0_3_p1_3 = (p0[3] - p1[3]);
    double p0_4_p1_4 = (p0[4] - p1[4]);
    double p0_5_p1_5 = (p0[5] - p1[5]);
    double p0_6_p1_6 = (p0[6] - p1[6]);
    double r;
    r = (1 * (((((((p0_0_p1_0 * p0_0_p1_0) + (p0_1_p1_1 * p0_1_p1_1)) + (p0_2_p1_2 * p0_2_p1_2)) + (p0_3_p1_3 * p0_3_p1_3)) + (p0_4_p1_4 * p0_4_p1_4)) + (p0_5_p1_5 * p0_5_p1_5)) + (p0_6_p1_6 * p0_6_p1_6)));
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double p1_4_p0_4 = (p1[4] - p0[4]);
    double q0_4_p0_4 = (q0[4] - p0[4]);
    double p1_5_p0_5 = (p1[5] - p0[5]);
    double q0_5_p0_5 = (q0[5] - p0[5]);
    double p1_6_p0_6 = (p1[6] - p0[6]);
    double q0_6_p0_6 = (q0[6] - p0[6]);
    r = (r - (2 * (((((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)) + (p1_4_p0_4 * q0_4_p0_4)) + (p1_5_p0_5 * q0_5_p0_5)) + (p1_6_p0_6 * q0_6_p0_6))));
    int int_tmp_result;
    double eps;
    double max1 = fabs(p0_0_p1_0);
    if( (max1 < fabs(p0_1_p1_1)) )
    {
        max1 = fabs(p0_1_p1_1);
    } 
    if( (max1 < fabs(p0_2_p1_2)) )
    {
        max1 = fabs(p0_2_p1_2);
    } 
    if( (max1 < fabs(p0_3_p1_3)) )
    {
        max1 = fabs(p0_3_p1_3);
    } 
    if( (max1 < fabs(p0_4_p1_4)) )
    {
        max1 = fabs(p0_4_p1_4);
    } 
    if( (max1 < fabs(p0_5_p1_5)) )
    {
        max1 = fabs(p0_5_p1_5);
    } 
    if( (max1 < fabs(p0_6_p1_6)) )
    {
        max1 = fabs(p0_6_p1_6);
    } 
    if( (max1 < fabs(p1_0_p0_0)) )
    {
        max1 = fabs(p1_0_p0_0);
    } 
    if( (max1 < fabs(p1_1_p0_1)) )
    {
        max1 = fabs(p1_1_p0_1);
    } 
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_3_p0_3)) )
    {
        max1 = fabs(p1_3_p0_3);
    } 
    if( (max1 < fabs(p1_4_p0_4)) )
    {
        max1 = fabs(p1_4_p0_4);
    } 
    if( (max1 < fabs(p1_5_p0_5)) )
    {
        max1 = fabs(p1_5_p0_5);
    } 
    if( (max1 < fabs(p1_6_p0_6)) )
    {
        max1 = fabs(p1_6_p0_6);
    } 
    double max2 = fabs(p0_0_p1_0);
    if( (max2 < fabs(p0_1_p1_1)) )
    {
        max2 = fabs(p0_1_p1_1);
    } 
    if( (max2 < fabs(p0_2_p1_2)) )
    {
        max2 = fabs(p0_2_p1_2);
    } 
    if( (max2 < fabs(p0_3_p1_3)) )
    {
        max2 = fabs(p0_3_p1_3);
    } 
    if( (max2 < fabs(p0_4_p1_4)) )
    {
        max2 = fabs(p0_4_p1_4);
    } 
    if( (max2 < fabs(p0_5_p1_5)) )
    {
        max2 = fabs(p0_5_p1_5);
    } 
    if( (max2 < fabs(p0_6_p1_6)) )
    {
        max2 = fabs(p0_6_p1_6);
    } 
    if( (max2 < fabs(q0_0_p0_0)) )
    {
        max2 = fabs(q0_0_p0_0);
    } 
    if( (max2 < fabs(q0_1_p0_1)) )
    {
        max2 = fabs(q0_1_p0_1);
    } 
    if( (max2 < fabs(q0_2_p0_2)) )
    {
        max2 = fabs(q0_2_p0_2);
    } 
    if( (max2 < fabs(q0_3_p0_3)) )
    {
        max2 = fabs(q0_3_p0_3);
    } 
    if( (max2 < fabs(q0_4_p0_4)) )
    {
        max2 = fabs(q0_4_p0_4);
    } 
    if( (max2 < fabs(q0_5_p0_5)) )
    {
        max2 = fabs(q0_5_p0_5);
    } 
    if( (max2 < fabs(q0_6_p0_6)) )
    {
        max2 = fabs(q0_6_p0_6);
    } 
    double lower_bound_1;
    double upper_bound_1;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (lower_bound_1 < 1.27080861580266953580e-147) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 5.59936185544450928309e+101) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (1.37779349582504943796e-14 * (max1 * max2));
        if( (r > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    return int_tmp_result;
}